

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

void __thiscall ODDLParser::Name::Name(Name *this,Name *name)

{
  Text *this_00;
  Name *name_local;
  Name *this_local;
  
  this->m_type = name->m_type;
  this_00 = (Text *)operator_new(0x18);
  Text::Text(this_00,name->m_id->m_buffer,name->m_id->m_len);
  this->m_id = this_00;
  return;
}

Assistant:

Name::Name(const Name &name) {
    m_type = name.m_type;
    m_id = new Text(name.m_id->m_buffer, name.m_id->m_len);
}